

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O3

bool megumax::legal_pv(Position *pos,MoveList *move_list)

{
  pointer pMVar1;
  bool bVar2;
  MoveList *__range1;
  int iVar3;
  int iVar4;
  Move *move;
  pointer pMVar5;
  
  pMVar5 = (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pMVar5 == pMVar1) {
LAB_0010f8ae:
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      bVar2 = libchess::Position::is_legal_move(pos,(Move)pMVar5->value_);
      if (!bVar2) {
        if (iVar3 == 0) goto LAB_0010f8ae;
        break;
      }
      libchess::Position::make_move(pos,(Move)pMVar5->value_);
      pMVar5 = pMVar5 + 1;
      iVar3 = iVar3 + -1;
    } while (pMVar5 != pMVar1);
    iVar3 = -iVar3;
    iVar4 = iVar3;
    do {
      libchess::Position::unmake_move(pos);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return iVar3 == (int)((ulong)((long)(move_list->values_).
                                      super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(move_list->values_).
                                     super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2);
}

Assistant:

bool legal_pv(Position& pos, MoveList&& move_list) {
    int ply = 0;

    for (const auto& move : move_list) {
        if (pos.is_legal_move(move)) {
            pos.make_move(move);
            ply++;
        } else {
            break;
        }
    }

    for (int i = 0; i < ply; ++i) {
        pos.unmake_move();
    }

    return ply == move_list.size();
}